

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector4f.cpp
# Opt level: O1

Vector4f * __thiscall Vector4f::operator=(Vector4f *this,Vector4f *rv)

{
  if (this != rv) {
    this->m_elements[0] = rv->m_elements[0];
    this->m_elements[1] = rv->m_elements[1];
    this->m_elements[2] = rv->m_elements[2];
    this->m_elements[3] = rv->m_elements[3];
  }
  return this;
}

Assistant:

Vector4f& Vector4f::operator = ( const Vector4f& rv )
{
	if( this != &rv )
	{
		m_elements[0] = rv.m_elements[0];
		m_elements[1] = rv.m_elements[1];
		m_elements[2] = rv.m_elements[2];
		m_elements[3] = rv.m_elements[3];
	}
	return *this;
}